

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

char * kj::_::fill<kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>>
                 (char *target,FixedArray<char,_1UL> *first,CappedArray<char,_14UL> *rest)

{
  char *pcVar1;
  
  *target = first->content[0];
  pcVar1 = fill<kj::CappedArray<char,14ul>>(target + 1,rest);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}